

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O1

lzma_ret lzma2_encode(void *coder_ptr,lzma_mf *mf,uint8_t *out,size_t *out_pos,size_t out_size)

{
  size_t *in_pos;
  char *pcVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  lzma_action lVar5;
  size_t sVar6;
  uint uVar7;
  uint32_t limit;
  lzma_ret lVar8;
  int iVar9;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  lzma_ret local_84;
  
  uVar10 = *out_pos;
  if (out_size <= uVar10) {
    return LZMA_OK;
  }
  in_pos = (size_t *)((long)coder_ptr + 0x98);
  do {
    switch(*coder_ptr) {
    case 0:
      if ((mf->write_pos - mf->read_pos) + mf->read_ahead == 0) {
        lVar5 = mf->action;
        if (lVar5 == LZMA_FINISH) {
          *out_pos = uVar10 + 1;
          out[uVar10] = '\0';
        }
        return (uint)(lVar5 != LZMA_RUN);
      }
      if ((*(char *)((long)coder_ptr + 0x81) == '\x01') &&
         (lVar8 = lzma_lzma_encoder_reset
                            (*(lzma_lzma1_encoder **)((long)coder_ptr + 8),
                             (lzma_options_lzma *)((long)coder_ptr + 0x10)), lVar8 != LZMA_OK)) {
        return lVar8;
      }
      *(undefined8 *)((long)coder_ptr + 0x88) = 0;
      *(undefined8 *)((long)coder_ptr + 0x90) = 0;
      *(undefined4 *)coder_ptr = 1;
switchD_007643bb_caseD_1:
      uVar7 = 0x200000 - *(int *)((long)coder_ptr + 0x88);
      limit = 0;
      if (mf->match_len_max <= uVar7) {
        limit = (uVar7 + mf->read_pos) - (mf->match_len_max + mf->read_ahead);
      }
      uVar3 = mf->read_pos;
      uVar4 = mf->read_ahead;
      lVar8 = lzma_lzma_encode(*(lzma_lzma1_encoder **)((long)coder_ptr + 8),mf,
                               (uint8_t *)((long)coder_ptr + 0xa6),
                               (size_t *)((long)coder_ptr + 0x90),0x10000,limit);
      uVar7 = mf->read_ahead;
      uVar12 = (ulong)(((uVar4 + mf->read_pos) - uVar7) - uVar3) + *(long *)((long)coder_ptr + 0x88)
      ;
      *(ulong *)((long)coder_ptr + 0x88) = uVar12;
      uVar10 = *(ulong *)((long)coder_ptr + 0x90);
      if (0x10000 < uVar10) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc6,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < uVar12) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,199,
                      "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar8 == LZMA_STREAM_END) {
        if (uVar10 < uVar12) {
          if (uVar10 == 0) {
            __assert_fail("coder->compressed_size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x3b,"void lzma2_header_lzma(lzma_lzma2_coder *)");
          }
          cVar2 = *(char *)((long)coder_ptr + 0x80);
          if (cVar2 == '\x01') {
            if (*(char *)((long)coder_ptr + 0x82) == '\x01') {
              *(undefined1 *)((long)coder_ptr + 0xa0) = 0xe0;
            }
            else {
              *(undefined1 *)((long)coder_ptr + 0xa0) = 0xc0;
            }
            lVar14 = 0;
          }
          else {
            if (*(char *)((long)coder_ptr + 0x81) == '\x01') {
              *(undefined1 *)((long)coder_ptr + 0xa1) = 0xa0;
            }
            else {
              *(undefined1 *)((long)coder_ptr + 0xa1) = 0x80;
            }
            lVar14 = 1;
          }
          *(long *)((long)coder_ptr + 0x98) = lVar14;
          lVar13 = uVar12 - 1;
          pcVar1 = (char *)((long)coder_ptr + lVar14 + 0xa0);
          *pcVar1 = *pcVar1 + (char)((ulong)lVar13 >> 0x10);
          *(char *)((long)coder_ptr + lVar14 + 0xa1) = (char)((ulong)lVar13 >> 8);
          *(char *)((long)coder_ptr + lVar14 + 0xa2) = (char)lVar13;
          *(char *)((long)coder_ptr + lVar14 + 0xa3) = (char)(uVar10 - 1 >> 8);
          *(char *)((long)coder_ptr + lVar14 + 0xa4) = (char)(uVar10 - 1);
          if (cVar2 != '\0') {
            lzma_lzma_lclppb_encode
                      ((lzma_options_lzma *)((long)coder_ptr + 0x10),
                       (uint8_t *)((long)coder_ptr + lVar14 + 0xa5));
          }
          *(undefined2 *)((long)coder_ptr + 0x80) = 0;
          *(undefined1 *)((long)coder_ptr + 0x82) = 0;
          *(long *)((long)coder_ptr + 0x90) = *(long *)((long)coder_ptr + 0x90) + 6;
          iVar9 = 0;
          uVar11 = 2;
        }
        else {
          uVar12 = uVar12 + uVar7;
          *(ulong *)((long)coder_ptr + 0x88) = uVar12;
          if (0x200000 < uVar12) {
            __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0xd2,
                          "lzma_ret lzma2_encode(void *, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          mf->read_ahead = 0;
          if (uVar12 == 0) {
            __assert_fail("coder->uncompressed_size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x71,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
          }
          if (0x10000 < uVar12) {
            __assert_fail("coder->uncompressed_size <= LZMA2_CHUNK_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x72,"void lzma2_header_uncompressed(lzma_lzma2_coder *)");
          }
          if (*(char *)((long)coder_ptr + 0x82) == '\x01') {
            *(undefined1 *)((long)coder_ptr + 0xa0) = 1;
          }
          else {
            *(undefined1 *)((long)coder_ptr + 0xa0) = 2;
          }
          *(char *)((long)coder_ptr + 0xa1) = (char)((uint)((int)uVar12 + -1) >> 8);
          *(char *)((long)coder_ptr + 0xa2) = (char)uVar12 + -1;
          *(undefined8 *)((long)coder_ptr + 0x98) = 0;
          *(undefined2 *)((long)coder_ptr + 0x81) = 1;
          iVar9 = 4;
          uVar11 = 3;
        }
        *(undefined4 *)coder_ptr = uVar11;
      }
      else {
        local_84 = LZMA_OK;
        iVar9 = 1;
      }
      if (iVar9 != 4) {
        if (iVar9 != 0) {
          return local_84;
        }
switchD_007643bb_caseD_2:
        lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xa0),in_pos,*(size_t *)((long)coder_ptr + 0x90),
                    out,out_pos,out_size);
        if (*(long *)((long)coder_ptr + 0x98) != *(long *)((long)coder_ptr + 0x90)) {
          return LZMA_OK;
        }
LAB_007646ef:
        *(undefined4 *)coder_ptr = 0;
      }
switchD_007643bb_default:
      uVar10 = *out_pos;
      if (out_size <= uVar10) {
        return LZMA_OK;
      }
      break;
    case 1:
      goto switchD_007643bb_caseD_1;
    case 2:
      goto switchD_007643bb_caseD_2;
    case 3:
      lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xa0),in_pos,3,out,out_pos,out_size);
      if (*in_pos != 3) {
        return LZMA_OK;
      }
      *(undefined4 *)coder_ptr = 4;
    case 4:
      if (mf->read_ahead != 0) {
        __assert_fail("mf->read_ahead == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                      ,0x11d,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
      }
      uVar10 = *(ulong *)((long)coder_ptr + 0x88);
      if (mf->read_pos < uVar10) {
        __assert_fail("mf->read_pos >= *left",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                      ,0x11e,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
      }
      sVar6 = *out_pos;
      uVar15 = out_size - sVar6;
      uVar12 = uVar10;
      if (uVar15 < uVar10) {
        uVar12 = uVar15;
      }
      memcpy(out + sVar6,mf->buffer + (mf->read_pos - uVar10),uVar12);
      *out_pos = sVar6 + uVar12;
      *(ulong *)((long)coder_ptr + 0x88) = uVar10 - uVar12;
      if (uVar15 < uVar10) {
        return LZMA_OK;
      }
      goto LAB_007646ef;
    default:
      goto switchD_007643bb_default;
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_encode(void *coder_ptr, lzma_mf *restrict mf,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size)
{
	lzma_lzma2_coder *restrict coder = coder_ptr;

	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		const uint32_t read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		const lzma_ret ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}